

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O2

void __thiscall
QtMWidgets::SwitchPrivate::drawText
          (SwitchPrivate *this,QPainter *p,QStyleOption *opt,QColor *on,QColor *off)

{
  long lVar1;
  QString *pQVar2;
  QRect r;
  
  r.x1 = this->radius;
  r.x2 = (*(int *)(opt + 0x18) + r.x1) - (r.x1 * 2 + *(int *)(opt + 0x10));
  r.y1 = 0;
  r.y2 = r.x1 * 2 + -1;
  if (this->state < NotAcceptedCheck) {
    if ((this->offText).d.size == 0) {
      return;
    }
    pQVar2 = (QString *)0x182;
    lVar1 = 0x28;
  }
  else {
    if (1 < this->state - NotAcceptedCheck) {
      return;
    }
    if ((this->onText).d.size == 0) {
      return;
    }
    pQVar2 = (QString *)0x181;
    lVar1 = 0x10;
  }
  QPainter::setPen((QColor *)p);
  QPainter::drawText((QRect *)p,(int)&r,pQVar2,(QRect *)((long)&this->q + lVar1));
  return;
}

Assistant:

void
SwitchPrivate::drawText( QPainter * p, const QStyleOption & opt,
	const QColor & on, const QColor & off )
{
	const QRect r( radius, 0, opt.rect.width() - radius * 2, radius * 2 );

	switch( state )
	{
		case Switch::NotAcceptedCheck :
		case Switch::AcceptedCheck :
		{
			if( !onText.isEmpty() )
			{
				p->setPen( on );
				p->drawText( r,
					Qt::AlignLeft | Qt::TextSingleLine | Qt::AlignVCenter,
					onText );
			}
		}
		break;

		case Switch::NotAcceptedUncheck :
		case Switch::AcceptedUncheck :
		{
			if( !offText.isEmpty() )
			{
				p->setPen( off );
				p->drawText( r,
					Qt::AlignRight | Qt::TextSingleLine | Qt::AlignVCenter,
					offText );
			}
		}
		break;
	}
}